

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestPackColumns(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  pointer pnVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int iVar10;
  Dring *pDVar11;
  long lVar12;
  long lVar13;
  cpp_dec_float<50U,_int,_void> *this_00;
  cpp_dec_float<50U,_int,_void> *v;
  
  pCVar1 = &(this->u).col;
  piVar4 = (this->u).col.idx;
  pnVar5 = (this->u).col.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar6 = (this->u).col.len;
  piVar8 = (this->u).col.max;
  piVar7 = (this->u).col.start;
  iVar10 = 0;
  pDVar11 = &pCVar1->list;
  while (pDVar11 = ((Dring *)&pDVar11->next)->next, (Col *)pDVar11 != pCVar1) {
    iVar2 = pDVar11->idx;
    if (piVar7[iVar2] != iVar10) goto LAB_00255fa9;
    iVar3 = piVar6[iVar2];
    iVar10 = iVar10 + iVar3;
    piVar8[iVar2] = iVar3;
  }
LAB_00256043:
  (this->u).col.used = iVar10;
  piVar8[this->thedim] = 0;
  return;
LAB_00255fa9:
  do {
    iVar2 = pDVar11->idx;
    lVar12 = (long)piVar7[iVar2];
    piVar7[iVar2] = iVar10;
    iVar3 = piVar6[iVar2];
    piVar8[iVar2] = iVar3;
    lVar13 = iVar3 + lVar12;
    this_00 = &pnVar5[iVar10].m_backend;
    piVar9 = piVar4 + iVar10;
    v = &pnVar5[lVar12].m_backend;
    for (; lVar12 < lVar13; lVar12 = lVar12 + 1) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,v);
      *piVar9 = piVar4[lVar12];
      iVar10 = iVar10 + 1;
      this_00 = this_00 + 1;
      piVar9 = piVar9 + 1;
      v = v + 1;
    }
    pDVar11 = pDVar11->next;
  } while ((Col *)pDVar11 != pCVar1);
  piVar8 = (this->u).col.max;
  goto LAB_00256043;
}

Assistant:

void CLUFactor<R>::forestPackColumns()
{
   int n, i, j, colno;
   Dring* ring, *list;

   R* cval = u.col.val.data();
   int* cidx = u.col.idx;
   int* clen = u.col.len;
   int* cmax = u.col.max;
   int* cbeg = u.col.start;

   n = 0;
   list = &u.col.list;

   for(ring = list->next; ring != list; ring = ring->next)
   {
      colno = ring->idx;

      if(cbeg[colno] != n)
      {
         do
         {
            colno = ring->idx;
            i = cbeg[colno];
            cbeg[colno] = n;
            cmax[colno] = clen[colno];
            j = i + clen[colno];

            for(; i < j; ++i)
            {
               cval[n] = cval[i];
               cidx[n++] = cidx[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += clen[colno];

      cmax[colno] = clen[colno];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}